

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O3

void __thiscall PyreNet::LayerThreadPool::LayerThreadPool(LayerThreadPool *this)

{
  int iVar1;
  
  (this->pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::condition_variable::condition_variable(&this->jobDoneCv);
  std::condition_variable::condition_variable(&this->newJobCv);
  memset(&this->trackMutex,0,0xa0);
  std::
  _Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
  ::_M_initialize_map((_Deque_base<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>
                       *)&this->layerQueue,0);
  iVar1 = 0x10;
  instance = this;
  do {
    std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
              ((vector<std::thread,std::allocator<std::thread>> *)this,threadJob);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

PyreNet::LayerThreadPool::LayerThreadPool() {
        instance = this;
        for (int i = 0; i < 16; ++i) {
            pool.emplace_back(threadJob);
        }
    }